

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImStb::stb_textedit_replace
               (ImGuiInputTextState *str,STB_TexteditState *state,ImWchar *text,int text_len)

{
  bool bVar1;
  int text_len_local;
  ImWchar *text_local;
  STB_TexteditState *state_local;
  ImGuiInputTextState *str_local;
  
  stb_text_makeundo_replace(str,state,0,str->CurLenW,text_len);
  STB_TEXTEDIT_DELETECHARS(str,0,str->CurLenW);
  if (0 < text_len) {
    bVar1 = STB_TEXTEDIT_INSERTCHARS(str,0,text,text_len);
    if (!bVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0xe34,
                    "void ImStb::stb_textedit_replace(ImGuiInputTextState *, STB_TexteditState *, const ImWchar *, int)"
                   );
    }
    state->cursor = text_len;
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

static void stb_textedit_replace(STB_TEXTEDIT_STRING* str, STB_TexteditState* state, const STB_TEXTEDIT_CHARTYPE* text, int text_len)
{
    stb_text_makeundo_replace(str, state, 0, str->CurLenW, text_len);
    ImStb::STB_TEXTEDIT_DELETECHARS(str, 0, str->CurLenW);
    if (text_len <= 0)
        return;
    if (ImStb::STB_TEXTEDIT_INSERTCHARS(str, 0, text, text_len))
    {
        state->cursor = text_len;
        state->has_preferred_x = 0;
        return;
    }
    IM_ASSERT(0); // Failed to insert character, normally shouldn't happen because of how we currently use stb_textedit_replace()
}